

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation
          (FoldSpecConstantOpAndCompositePass *this,inst_iterator *pos)

{
  pointer *this_00;
  anon_class_16_2_0fe9532d __pred;
  bool bVar1;
  int iVar2;
  uint32_t num_dims_00;
  Instruction *pIVar3;
  IRContext *pIVar4;
  ConstantManager *this_01;
  Type *type;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstructionFolder *pIVar5;
  Constant *pCVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Type *type_00;
  undefined4 extraout_var_03;
  reference puVar7;
  undefined4 extraout_var_04;
  unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
  local_160;
  Constant *local_158;
  Constant *reg_vec_const;
  unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
  local_148;
  unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
  new_vec_const;
  Constant *local_118;
  Constant *rc;
  iterator iStack_108;
  uint32_t r;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  result_vector_components;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_vec;
  uint32_t num_dims;
  Type *element_type;
  Constant *local_88;
  Constant *result_const;
  uint32_t result_val;
  FoldSpecConstantOpAndCompositePass *local_70;
  Operand *local_68;
  __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_60;
  undefined1 local_58 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  operands;
  Op spec_opcode;
  Type *result_type;
  ConstantManager *const_mgr;
  Instruction *inst;
  inst_iterator *pos_local;
  FoldSpecConstantOpAndCompositePass *this_local;
  
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*(&pos->super_iterator);
  pIVar4 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_constant_mgr(pIVar4);
  type = analysis::ConstantManager::GetType(this_01,pIVar3);
  operands.
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       opt::Instruction::GetSingleWordInOperand(pIVar3,0);
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)local_58);
  local_60._M_current = (Operand *)opt::Instruction::cbegin(pIVar3);
  local_68 = (Operand *)opt::Instruction::cend(pIVar3);
  _result_val = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 *)local_58;
  __pred.this = this;
  __pred.operands = _result_val;
  local_70 = this;
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<spvtools::opt::Operand_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>,spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(spvtools::opt::InstructionList::iterator*)::__0>
                    (local_60,(__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                               )local_68,__pred);
  if (bVar1) {
    iVar2 = (*type->_vptr_Type[10])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      iVar2 = (*type->_vptr_Type[8])();
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        iVar2 = (*type->_vptr_Type[0xe])();
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          this_local = (FoldSpecConstantOpAndCompositePass *)0x0;
          result_const._4_4_ = 1;
        }
        else {
          iVar2 = (*type->_vptr_Type[0xe])();
          type_00 = analysis::Vector::element_type((Vector *)CONCAT44(extraout_var_02,iVar2));
          iVar2 = (*type->_vptr_Type[0xe])();
          num_dims_00 = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_03,iVar2));
          pIVar4 = Pass::context(&this->super_Pass);
          pIVar5 = IRContext::get_instruction_folder(pIVar4);
          InstructionFolder::FoldVectors
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &result_vector_components.
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar5,
                     operands.
                     super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,num_dims_00,
                     (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      *)local_58);
          std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)&__range4);
          this_00 = &result_vector_components.
                     super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          iStack_108 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffef8);
            if (!bVar1) break;
            puVar7 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&__end4);
            rc._4_4_ = *puVar7;
            anon_unknown_14::EncodeIntegerAsWords
                      ((SmallVector<unsigned_int,_2UL> *)&new_vec_const,type_00,rc._4_4_);
            pCVar6 = analysis::ConstantManager::
                     GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                               (this_01,type_00,(SmallVector<unsigned_int,_2UL> *)&new_vec_const);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                      ((SmallVector<unsigned_int,_2UL> *)&new_vec_const);
            local_118 = pCVar6;
            if (pCVar6 == (Constant *)0x0) {
              __assert_fail("false && \"Failed to create constants with 32-bit word\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                            ,0x13a,
                            "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                           );
            }
            std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::push_back((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         *)&__range4,&local_118);
            pIVar3 = analysis::ConstantManager::BuildInstructionAndAddToModule
                               (this_01,local_118,pos,0);
            if (pIVar3 == (Instruction *)0x0) {
              __assert_fail("false && \"Failed to build and insert constant declaring instruction \" \"for the given vector component constant\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                            ,0x137,
                            "Instruction *spvtools::opt::FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(Module::inst_iterator *)"
                           );
            }
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&__end4);
          }
          iVar2 = (*type->_vptr_Type[0xe])();
          reg_vec_const = (Constant *)CONCAT44(extraout_var_04,iVar2);
          MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                    ((spvtools *)&local_148,(Vector **)&reg_vec_const,
                     (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      *)&__range4);
          std::
          unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
          ::
          unique_ptr<spvtools::opt::analysis::VectorConstant,std::default_delete<spvtools::opt::analysis::VectorConstant>,void>
                    ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                      *)&local_160,&local_148);
          pCVar6 = analysis::ConstantManager::RegisterConstant(this_01,&local_160);
          std::
          unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
          ::~unique_ptr(&local_160);
          local_158 = pCVar6;
          this_local = (FoldSpecConstantOpAndCompositePass *)
                       analysis::ConstantManager::BuildInstructionAndAddToModule
                                 (this_01,pCVar6,pos,0);
          result_const._4_4_ = 1;
          std::
          unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
          ::~unique_ptr(&local_148);
          std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)&__range4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &result_vector_components.
                      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        goto LAB_0097d297;
      }
    }
    pIVar4 = Pass::context(&this->super_Pass);
    pIVar5 = IRContext::get_instruction_folder(pIVar4);
    result_const._0_4_ =
         InstructionFolder::FoldScalars
                   (pIVar5,operands.
                           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                    (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)local_58);
    anon_unknown_14::EncodeIntegerAsWords
              ((SmallVector<unsigned_int,_2UL> *)&element_type,type,(uint32_t)result_const);
    pCVar6 = analysis::ConstantManager::GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
                       (this_01,type,(SmallVector<unsigned_int,_2UL> *)&element_type);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&element_type);
    local_88 = pCVar6;
    this_local = (FoldSpecConstantOpAndCompositePass *)
                 analysis::ConstantManager::BuildInstructionAndAddToModule(this_01,pCVar6,pos,0);
    result_const._4_4_ = 1;
  }
  else {
    this_local = (FoldSpecConstantOpAndCompositePass *)0x0;
    result_const._4_4_ = 1;
  }
LAB_0097d297:
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             *)local_58);
  return (Instruction *)this_local;
}

Assistant:

Instruction* FoldSpecConstantOpAndCompositePass::DoComponentWiseOperation(
    Module::inst_iterator* pos) {
  const Instruction* inst = &**pos;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Type* result_type = const_mgr->GetType(inst);
  spv::Op spec_opcode = static_cast<spv::Op>(inst->GetSingleWordInOperand(0));
  // Check and collect operands.
  std::vector<const analysis::Constant*> operands;

  if (!std::all_of(
          inst->cbegin(), inst->cend(), [&operands, this](const Operand& o) {
            // skip the operands that is not an id.
            if (o.type != spv_operand_type_t::SPV_OPERAND_TYPE_ID) return true;
            uint32_t id = o.words.front();
            if (auto c =
                    context()->get_constant_mgr()->FindDeclaredConstant(id)) {
              if (IsValidTypeForComponentWiseOperation(c->type())) {
                operands.push_back(c);
                return true;
              }
            }
            return false;
          }))
    return nullptr;

  if (result_type->AsInteger() || result_type->AsBool()) {
    // Scalar operation
    const uint32_t result_val =
        context()->get_instruction_folder().FoldScalars(spec_opcode, operands);
    auto result_const = const_mgr->GetConstant(
        result_type, EncodeIntegerAsWords(*result_type, result_val));
    return const_mgr->BuildInstructionAndAddToModule(result_const, pos);
  } else if (result_type->AsVector()) {
    // Vector operation
    const analysis::Type* element_type =
        result_type->AsVector()->element_type();
    uint32_t num_dims = result_type->AsVector()->element_count();
    std::vector<uint32_t> result_vec =
        context()->get_instruction_folder().FoldVectors(spec_opcode, num_dims,
                                                        operands);
    std::vector<const analysis::Constant*> result_vector_components;
    for (const uint32_t r : result_vec) {
      if (auto rc = const_mgr->GetConstant(
              element_type, EncodeIntegerAsWords(*element_type, r))) {
        result_vector_components.push_back(rc);
        if (!const_mgr->BuildInstructionAndAddToModule(rc, pos)) {
          assert(false &&
                 "Failed to build and insert constant declaring instruction "
                 "for the given vector component constant");
        }
      } else {
        assert(false && "Failed to create constants with 32-bit word");
      }
    }
    auto new_vec_const = MakeUnique<analysis::VectorConstant>(
        result_type->AsVector(), result_vector_components);
    auto reg_vec_const = const_mgr->RegisterConstant(std::move(new_vec_const));
    return const_mgr->BuildInstructionAndAddToModule(reg_vec_const, pos);
  } else {
    // Cannot process invalid component wise operation. The result of component
    // wise operation must be of integer or bool scalar or vector of
    // integer/bool type.
    return nullptr;
  }
}